

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_interrupt(DisasContext *s,int intno,target_ulong cur_eip,target_ulong next_eip)

{
  TCGContext *tcg_ctx;
  TCGContext *tcg_ctx_00;
  TCGv_ptr pTVar1;
  uintptr_t o_1;
  TCGv_i32 pTVar2;
  uintptr_t o;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_update_cc_op(s);
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_op2_x86_64(tcg_ctx_00,INDEX_op_movi_i64,(TCGArg)(s->tmp0 + (long)tcg_ctx_00),cur_eip);
  tcg_gen_op3_x86_64(tcg_ctx_00,INDEX_op_st_i64,(TCGArg)(s->tmp0 + (long)tcg_ctx_00),
                     (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),0x80);
  pTVar1 = tcg_ctx->cpu_env;
  pTVar2 = tcg_const_i32_x86_64(tcg_ctx,intno);
  local_38 = tcg_const_i32_x86_64(tcg_ctx,(int)next_eip - (int)cur_eip);
  local_40 = pTVar2 + (long)tcg_ctx;
  local_38 = local_38 + (long)tcg_ctx;
  local_48 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_x86_64(tcg_ctx,helper_raise_interrupt_x86_64,(TCGTemp *)0x0,3,&local_48);
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_interrupt(DisasContext *s, int intno,
                          target_ulong cur_eip, target_ulong next_eip)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_update_cc_op(s);
    gen_jmp_im(s, cur_eip);
    gen_helper_raise_interrupt(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, intno),
                               tcg_const_i32(tcg_ctx, next_eip - cur_eip));
    s->base.is_jmp = DISAS_NORETURN;
}